

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  cmGeneratorTarget *this_01;
  pointer ppcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  mapped_type *this_02;
  pointer ppcVar5;
  pointer ppcVar6;
  bool hasSourceExtension;
  string dir;
  cmGeneratorTarget *gt;
  string objectName;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  bool local_d9;
  string local_d8;
  cmGeneratorTarget *local_b8;
  cmLocalUnixMakefileGenerator3 *local_b0;
  string local_a8;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_88;
  string local_68;
  pointer local_48;
  pointer local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_38;
  
  ppcVar6 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar6 != local_40) {
    local_b0 = this;
    local_38 = localObjectFiles;
    do {
      local_b8 = *ppcVar6;
      TVar3 = cmGeneratorTarget::GetType(local_b8);
      this_01 = local_b8;
      if (TVar3 != INTERFACE_LIBRARY) {
        local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (local_b0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_BUILD_TYPE","");
        psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_d8);
        cmGeneratorTarget::GetObjectSources(this_01,&local_88,psVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        local_48 = ppcVar6;
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(local_b8->LocalGenerator);
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(psVar4->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_d8);
        (*(local_b0->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
          [0xc])(&local_a8,local_b0,local_b8);
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_d8);
        ppcVar1 = local_88.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar5 = local_88.
                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
            ppcVar5 = ppcVar5 + 1) {
          source = *ppcVar5;
          local_d9 = true;
          cmLocalGenerator::GetObjectFileNameWithoutTarget
                    (&local_a8,(cmLocalGenerator *)local_b0,source,&local_d8,&local_d9,(char *)0x0);
          bVar2 = cmsys::SystemTools::FileIsFullPath(&local_a8);
          if (bVar2) {
            cmsys::SystemTools::GetFilenameName(&local_68,&local_a8);
            std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                    ::operator[](local_38,&local_a8);
          this_02->HasSourceExtension = local_d9;
          cmSourceFile::GetLanguage_abi_cxx11_(&local_68,source);
          std::
          vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
          ::emplace_back<cmGeneratorTarget*&,std::__cxx11::string>
                    ((vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
                      *)this_02,&local_b8,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
        ppcVar6 = local_48;
        if (local_88.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != local_40);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetLocalObjectFiles(
  std::map<std::string, LocalObjectInfo>& localObjectFiles)
{
  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* gt : targets) {
    if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(
      objectSources, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(gt);
    dir += "/";
    // Compute the name of each object file.
    for (cmSourceFile const* sf : objectSources) {
      bool hasSourceExtension = true;
      std::string objectName =
        this->GetObjectFileNameWithoutTarget(*sf, dir, &hasSourceExtension);
      if (cmSystemTools::FileIsFullPath(objectName)) {
        objectName = cmSystemTools::GetFilenameName(objectName);
      }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.emplace_back(gt, sf->GetLanguage());
    }
  }
}